

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int tls1_prf(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
            size_t dlen)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_md_info_t *pmVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t ilen;
  ulong uVar8;
  mbedtls_md_context_t md_ctx;
  uchar h_i [20];
  uchar tmp [128];
  mbedtls_md_context_t local_110;
  ulong local_f8;
  uchar *local_f0;
  size_t local_e8;
  size_t local_e0;
  byte local_d8 [32];
  uchar local_b8 [136];
  
  mbedtls_md_init(&local_110);
  sVar3 = strlen(label);
  iVar2 = -0x7100;
  if (0xffffffffffffff7e < (sVar3 + rlen) - 0x6d) {
    memcpy(local_b8 + 0x14,label,sVar3);
    memcpy(local_b8 + sVar3 + 0x14,random,rlen);
    pmVar4 = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
    iVar2 = -0x6c00;
    if ((pmVar4 != (mbedtls_md_info_t *)0x0) &&
       (iVar2 = mbedtls_md_setup(&local_110,pmVar4,1), iVar2 == 0)) {
      local_f8 = slen + 1 >> 1;
      ilen = sVar3 + rlen;
      local_f0 = secret;
      mbedtls_md_hmac_starts(&local_110,secret,local_f8);
      mbedtls_md_hmac_update(&local_110,local_b8 + 0x14,ilen);
      puVar1 = local_b8 + 4;
      mbedtls_md_hmac_finish(&local_110,puVar1);
      if (dlen != 0) {
        local_e0 = ilen + 0x10;
        local_e8 = (size_t)((uint)dlen & 0xf);
        uVar8 = 0;
        do {
          mbedtls_md_hmac_reset(&local_110);
          mbedtls_md_hmac_update(&local_110,puVar1,local_e0);
          mbedtls_md_hmac_finish(&local_110,local_d8);
          mbedtls_md_hmac_reset(&local_110);
          mbedtls_md_hmac_update(&local_110,puVar1,0x10);
          mbedtls_md_hmac_finish(&local_110,puVar1);
          uVar7 = uVar8 + 0x10;
          sVar3 = 0x10;
          if (dlen < uVar7) {
            sVar3 = local_e8;
          }
          if (sVar3 != 0) {
            memcpy(dstbuf + uVar8,local_d8,sVar3);
          }
          uVar8 = uVar7;
        } while (uVar7 < dlen);
      }
      mbedtls_md_free(&local_110);
      pmVar4 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
      puVar1 = local_f0;
      iVar2 = -0x6c00;
      if ((pmVar4 != (mbedtls_md_info_t *)0x0) &&
         (iVar2 = mbedtls_md_setup(&local_110,pmVar4,1), iVar2 == 0)) {
        mbedtls_md_hmac_starts(&local_110,puVar1 + (slen - local_f8),local_f8);
        mbedtls_md_hmac_update(&local_110,local_b8 + 0x14,ilen);
        mbedtls_md_hmac_finish(&local_110,local_b8);
        if (dlen != 0) {
          uVar8 = 0;
          do {
            mbedtls_md_hmac_reset(&local_110);
            mbedtls_md_hmac_update(&local_110,local_b8,ilen + 0x14);
            mbedtls_md_hmac_finish(&local_110,local_d8);
            mbedtls_md_hmac_reset(&local_110);
            mbedtls_md_hmac_update(&local_110,local_b8,0x14);
            mbedtls_md_hmac_finish(&local_110,local_b8);
            uVar8 = uVar8 + 0x14;
            lVar5 = 0x14;
            if (dlen < uVar8) {
              lVar5 = dlen + (dlen / 5 & 0xfffffffffffffffc) * -5;
            }
            if (lVar5 != 0) {
              lVar6 = 0;
              do {
                dstbuf[lVar6] = dstbuf[lVar6] ^ local_d8[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar5 != lVar6);
            }
            dstbuf = dstbuf + 0x14;
          } while (uVar8 < dlen);
        }
        mbedtls_md_free(&local_110);
        lVar5 = 0;
        do {
          local_b8[lVar5] = '\0';
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x80);
        iVar2 = 0;
        lVar5 = 0;
        do {
          local_d8[lVar5] = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x14);
      }
    }
  }
  return iVar2;
}

Assistant:

static int tls1_prf( const unsigned char *secret, size_t slen,
                     const char *label,
                     const unsigned char *random, size_t rlen,
                     unsigned char *dstbuf, size_t dlen )
{
    size_t nb, hs;
    size_t i, j, k;
    const unsigned char *S1, *S2;
    unsigned char tmp[128];
    unsigned char h_i[20];
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    int ret;

    mbedtls_md_init( &md_ctx );

    if( sizeof( tmp ) < 20 + strlen( label ) + rlen )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    hs = ( slen + 1 ) / 2;
    S1 = secret;
    S2 = secret + slen - hs;

    nb = strlen( label );
    memcpy( tmp + 20, label, nb );
    memcpy( tmp + 20 + nb, random, rlen );
    nb += rlen;

    /*
     * First compute P_md5(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_MD5 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S1, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

    for( i = 0; i < dlen; i += 16 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 );
        mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

        k = ( i + 16 > dlen ) ? dlen % 16 : 16;

        for( j = 0; j < k; j++ )
            dstbuf[i + j]  = h_i[j];
    }

    mbedtls_md_free( &md_ctx );

    /*
     * XOR out with P_sha1(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S2, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, tmp );

    for( i = 0; i < dlen; i += 20 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 );
        mbedtls_md_hmac_finish( &md_ctx, tmp );

        k = ( i + 20 > dlen ) ? dlen % 20 : 20;

        for( j = 0; j < k; j++ )
            dstbuf[i + j] = (unsigned char)( dstbuf[i + j] ^ h_i[j] );
    }

    mbedtls_md_free( &md_ctx );

    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( h_i, sizeof( h_i ) );

    return( 0 );
}